

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHHasDuplicateConfigID_Test::TestBody
          (SSLTest_ECHHasDuplicateConfigID_Test *this)

{
  uint8_t config_id;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ech_config_len_00;
  size_t ech_config_00;
  bool bVar1;
  SSL_ECH_KEYS *__p;
  char *pcVar2;
  reference puVar3;
  evp_hpke_key_st *peVar4;
  EVP_HPKE_KEM *kem;
  pointer psVar5;
  char *in_R9;
  __0 *local_3b0;
  AssertHelper local_310;
  Message local_308;
  int local_300;
  uint local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2c8;
  Message local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<uint8_t> free_ech_config;
  AssertHelper local_278;
  Message local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__2;
  size_t ech_config_len;
  uint8_t *ech_config;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_HPKE_KEY key;
  const_iterator cStack_180;
  uint8_t id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_ECH_KEYS> keys;
  anon_struct_32_2_cc216076 *test;
  anon_struct_32_2_cc216076 *__end2;
  anon_struct_32_2_cc216076 *__begin2;
  anon_struct_32_2_cc216076 (*__range2) [4];
  iterator local_f0;
  size_type local_e8;
  allocator<unsigned_char> local_dd;
  uchar local_dc [4];
  iterator local_d8;
  size_type local_d0;
  allocator<unsigned_char> local_b2;
  uchar local_b1;
  iterator local_b0;
  size_type local_a8;
  bool *local_a0;
  undefined1 auStack_98 [8];
  anon_struct_32_2_cc216076 kTests [4];
  SSLTest_ECHHasDuplicateConfigID_Test *this_local;
  
  __range2._2_1_ = 1;
  local_a0 = (bool *)auStack_98;
  auStack_98 = (undefined1  [8])0x0;
  kTests[0].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  kTests[0].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  kTests[0].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_b1 = '\x01';
  local_b0 = &local_b1;
  local_a8 = 1;
  local_a0 = &kTests[0].has_duplicate;
  std::allocator<unsigned_char>::allocator(&local_b2);
  __l_01._M_len = local_a8;
  __l_01._M_array = local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0].has_duplicate,
             __l_01,&local_b2);
  kTests[1].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_dc[0] = '\x01';
  local_dc[1] = 2;
  local_dc[2] = 3;
  local_dc[3] = 0xff;
  local_d8 = local_dc;
  local_d0 = 4;
  local_a0 = &kTests[1].has_duplicate;
  std::allocator<unsigned_char>::allocator(&local_dd);
  __l_00._M_len = local_d0;
  __l_00._M_array = local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[1].has_duplicate,
             __l_00,&local_dd);
  kTests[2].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  __range2._4_1_ = 1;
  __range2._5_1_ = 2;
  __range2._6_1_ = 3;
  __range2._7_1_ = 1;
  local_f0 = (iterator)((long)&__range2 + 4);
  local_e8 = 4;
  local_a0 = &kTests[2].has_duplicate;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range2 + 3));
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[2].has_duplicate,__l,
             (allocator<unsigned_char> *)((long)&__range2 + 3));
  kTests[3].ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  __range2._2_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range2 + 3));
  std::allocator<unsigned_char>::~allocator(&local_dd);
  std::allocator<unsigned_char>::~allocator(&local_b2);
  for (__end2 = (anon_struct_32_2_cc216076 *)auStack_98;
      __end2 != (anon_struct_32_2_cc216076 *)&kTests[3].has_duplicate; __end2 = __end2 + 1) {
    __p = SSL_ECH_KEYS_new();
    std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_130,
               (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_160,(internal *)local_130,(AssertionResult *)0x4dabc5,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7b7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      testing::Message::~Message(&local_138);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (!bVar1) {
      __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&__end2->ids);
      cStack_180 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&__end2->ids);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe80), bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&__end3);
        config_id = *puVar3;
        internal::
        StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
        ::StackAllocatedMovable
                  ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar__1.message_);
        kem = EVP_hpke_x25519_hkdf_sha256();
        local_20c = EVP_HPKE_KEY_generate(peVar4,kem);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_208,&local_20c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar1) {
          testing::Message::Message(&local_218);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ech_config,(internal *)local_208,
                     (AssertionResult *)
                     "EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())","false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_220,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7bb,pcVar2);
          testing::internal::AssertHelper::operator=(&local_220,&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_220);
          std::__cxx11::string::~string((string *)&ech_config);
          testing::Message::~Message(&local_218);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        if (!bVar1) {
          peVar4 = internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__1.message_);
          in_R9 = (char *)0x10;
          local_264 = SSL_marshal_ech_config
                                ((uint8_t **)&ech_config_len,(size_t *)&gtest_ar__2.message_,
                                 config_id,peVar4,"public.example",0x10);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_260,&local_264,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
          if (!bVar1) {
            testing::Message::Message(&local_270);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&free_ech_config,(internal *)local_260,
                       (AssertionResult *)
                       "SSL_marshal_ech_config(&ech_config, &ech_config_len, id, key.get(), \"public.example\", 16)"
                       ,"false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_278,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7bf,pcVar2);
            testing::internal::AssertHelper::operator=(&local_278,&local_270);
            testing::internal::AssertHelper::~AssertHelper(&local_278);
            std::__cxx11::string::~string((string *)&free_ech_config);
            testing::Message::~Message(&local_270);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
          if (!bVar1) {
            std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                       (pointer)ech_config_len);
            psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            ech_config_00 = ech_config_len;
            ech_config_len_00 = gtest_ar__2.message_;
            peVar4 = internal::
                     StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                     ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                            *)&gtest_ar__1.message_);
            local_2b4 = SSL_ECH_KEYS_add(psVar5,1,(uint8_t *)ech_config_00,
                                         (size_t)ech_config_len_00._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl,peVar4);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2b0,&local_2b4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
            if (!bVar1) {
              testing::Message::Message(&local_2c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar.message_,(internal *)local_2b0,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config, ech_config_len, key.get())",
                         "false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x7c2,pcVar2);
              testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
              testing::internal::AssertHelper::~AssertHelper(&local_2c8);
              std::__cxx11::string::~string((string *)&gtest_ar.message_);
              testing::Message::~Message(&local_2c0);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
            std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          }
        }
        internal::
        StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
        ::~StackAllocatedMovable
                  ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
        if (bVar1) goto LAB_001820e9;
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end3);
      }
      local_2fc = __end2->has_duplicate & 1;
      psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      local_300 = SSL_ECH_KEYS_has_duplicate_config_id(psVar5);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_2f8,"test.has_duplicate ? 1 : 0",
                 "SSL_ECH_KEYS_has_duplicate_config_id(keys.get())",(int *)&local_2fc,&local_300);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
      if (!bVar1) {
        testing::Message::Message(&local_308);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7c6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_310,&local_308);
        testing::internal::AssertHelper::~AssertHelper(&local_310);
        testing::Message::~Message(&local_308);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
      bVar1 = false;
    }
LAB_001820e9:
    std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    if (bVar1) break;
  }
  local_3b0 = (__0 *)&kTests[3].has_duplicate;
  do {
    local_3b0 = local_3b0 + -0x20;
    (anonymous_namespace)::SSLTest_ECHHasDuplicateConfigID_Test::TestBody()::$_0::~__0(local_3b0);
  } while (local_3b0 != (__0 *)auStack_98);
  return;
}

Assistant:

TEST(SSLTest, ECHHasDuplicateConfigID) {
  const struct {
    std::vector<uint8_t> ids;
    bool has_duplicate;
  } kTests[] = {
      {{}, false},
      {{1}, false},
      {{1, 2, 3, 255}, false},
      {{1, 2, 3, 1}, true},
  };
  for (const auto &test : kTests) {
    bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
    ASSERT_TRUE(keys);
    for (const uint8_t id : test.ids) {
      bssl::ScopedEVP_HPKE_KEY key;
      ASSERT_TRUE(
          EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
      uint8_t *ech_config;
      size_t ech_config_len;
      ASSERT_TRUE(SSL_marshal_ech_config(&ech_config, &ech_config_len, id,
                                         key.get(), "public.example", 16));
      bssl::UniquePtr<uint8_t> free_ech_config(ech_config);
      ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                   ech_config, ech_config_len, key.get()));
    }

    EXPECT_EQ(test.has_duplicate ? 1 : 0,
              SSL_ECH_KEYS_has_duplicate_config_id(keys.get()));
  }
}